

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exactnns.h
# Opt level: O0

void __thiscall
ExactNNS<float,_KBalls<float>_>::ExactNNS
          (ExactNNS<float,_KBalls<float>_> *this,Matrix<float> *data,Matrix<float> *query,
          function<float_(const_float_*,_const_float_*,_unsigned_long)> *cluster_dist,
          size_t num_codebook,size_t clusterK,int topK,size_t max_iteration)

{
  function<float_(const_float_*,_const_float_*,_unsigned_long)> local_58;
  size_t local_38;
  size_t clusterK_local;
  size_t num_codebook_local;
  function<float_(const_float_*,_const_float_*,_unsigned_long)> *cluster_dist_local;
  Matrix<float> *query_local;
  Matrix<float> *data_local;
  ExactNNS<float,_KBalls<float>_> *this_local;
  
  this->_vptr_ExactNNS = (_func_int **)&PTR_probeOneBucket_00163c60;
  local_38 = clusterK;
  clusterK_local = num_codebook;
  num_codebook_local = (size_t)cluster_dist;
  cluster_dist_local = (function<float_(const_float_*,_const_float_*,_unsigned_long)> *)query;
  query_local = data;
  data_local = (Matrix<float> *)this;
  std::function<float_(const_float_*,_const_float_*,_unsigned_long)>::function
            (&local_58,cluster_dist);
  ProductQuantization<float,_KBalls<float>_>::ProductQuantization
            (&this->pq,data,query,&local_58,clusterK_local,local_38,max_iteration);
  std::function<float_(const_float_*,_const_float_*,_unsigned_long)>::~function(&local_58);
  this->data_ = query_local;
  this->query_ = (Matrix<float> *)cluster_dist_local;
  std::ofstream::ofstream(&this->upper_bound_log_,"logs/log_upper_bound_.log",_S_out);
  std::ofstream::ofstream(&this->lower_bound_log_,"logs/log_lower_bound_.log",_S_out);
  std::ofstream::ofstream(&this->percent_log_,"logs/log_percent_.log",_S_out);
  std::
  vector<std::priority_queue<DistDataMax<int>,_std::vector<DistDataMax<int>,_std::allocator<DistDataMax<int>_>_>,_std::less<DistDataMax<int>_>_>,_std::allocator<std::priority_queue<DistDataMax<int>,_std::vector<DistDataMax<int>,_std::allocator<DistDataMax<int>_>_>,_std::less<DistDataMax<int>_>_>_>_>
  ::vector(&this->maxHeaps_);
  this->topK_ = topK;
  search(this);
  writeResult(this);
  return;
}

Assistant:

ExactNNS(lshbox::Matrix<DataType>& data,
             lshbox::Matrix<DataType>& query,
             std::function< DataType (const DataType*, const DataType*, size_t) > cluster_dist,
             size_t num_codebook, size_t clusterK, int topK, size_t max_iteration)
            : pq(data, query, cluster_dist, num_codebook, clusterK, max_iteration),
              data_(data),
              query_(query),
              topK_(topK),
              upper_bound_log_("logs/log_upper_bound_.log"),
              lower_bound_log_("logs/log_lower_bound_.log"),
              percent_log_("logs/log_percent_.log") {

        //query
        search();
        // write result
        writeResult();
    }